

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O0

int32_t zng_inflateGetDictionary(zng_stream *strm,uint8_t *dictionary,uint32_t *dictLength)

{
  internal_state *piVar1;
  int iVar2;
  uint *in_RDX;
  void *in_RSI;
  zng_stream *in_RDI;
  inflate_state *state;
  int32_t local_4;
  
  iVar2 = inflateStateCheck(in_RDI);
  if (iVar2 == 0) {
    piVar1 = in_RDI->state;
    if ((piVar1->w_mask != 0) && (in_RSI != (void *)0x0)) {
      memcpy(in_RSI,(void *)(*(long *)&piVar1->high_water + (ulong)piVar1->lookahead),
             (ulong)(piVar1->w_mask - piVar1->lookahead));
      memcpy((void *)((long)in_RSI + ((ulong)piVar1->w_mask - (ulong)piVar1->lookahead)),
             *(void **)&piVar1->high_water,(ulong)piVar1->lookahead);
    }
    if (in_RDX != (uint *)0x0) {
      *in_RDX = piVar1->w_mask;
    }
    local_4 = 0;
  }
  else {
    local_4 = -2;
  }
  return local_4;
}

Assistant:

int32_t Z_EXPORT PREFIX(inflateGetDictionary)(PREFIX3(stream) *strm, uint8_t *dictionary, uint32_t *dictLength) {
    struct inflate_state *state;

    /* check state */
    if (inflateStateCheck(strm))
        return Z_STREAM_ERROR;
    state = (struct inflate_state *)strm->state;

    INFLATE_GET_DICTIONARY_HOOK(strm, dictionary, dictLength);  /* hook for IBM Z DFLTCC */

    /* copy dictionary */
    if (state->whave && dictionary != NULL) {
        memcpy(dictionary, state->window + state->wnext, state->whave - state->wnext);
        memcpy(dictionary + state->whave - state->wnext, state->window, state->wnext);
    }
    if (dictLength != NULL)
        *dictLength = state->whave;
    return Z_OK;
}